

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O1

void __thiscall utf8_valid_2_bytes_Test::TestBody(utf8_valid_2_bytes_Test *this)

{
  int cu0;
  int cu0_00;
  int cu1;
  uint cu1_00;
  
  cu0_00 = 0xc2;
  do {
    cu1_00 = 0;
    do {
      anon_unknown.dwarf_eb852::assert_is_valid_utf8((cu1_00 & 0xc0) == 0x80,2,cu0_00,cu1_00,0,0);
      cu1_00 = cu1_00 + 1;
    } while (cu1_00 != 0x100);
    cu0_00 = cu0_00 + 1;
  } while (cu0_00 != 0xe0);
  return;
}

Assistant:

TEST(utf8, valid_2_bytes) {
  FOR_RANGE(cu0, 0xc2, 0xe0) {
    FOR_EACH_BYTE(cu1) {
      bool is_valid = is_in_range(cu1, 0x80, 0xc0);
      assert_is_valid_utf8(is_valid, 2, cu0, cu1);
    }
  }
}